

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_dynamic.cpp
# Opt level: O2

BinCompat * __thiscall ritobin::io::BinCompat::get(BinCompat *this,string_view name)

{
  BinCompat *pBVar1;
  bool bVar2;
  char *__s;
  size_t sVar3;
  long lVar4;
  basic_string_view<char,_std::char_traits<char>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  
  __x._M_str = (char *)name._M_len;
  lVar4 = 0;
  do {
    if (lVar4 == 0x10) {
      return (BinCompat *)0x0;
    }
    pBVar1 = *(BinCompat **)((long)&compat_impl::bin_versions + lVar4);
    __s = (char *)(*(code *)**(undefined8 **)pBVar1)(pBVar1);
    sVar3 = strlen(__s);
    __x._M_len = (size_t)this;
    __y._M_str = __s;
    __y._M_len = sVar3;
    bVar2 = std::operator==(__x,__y);
    lVar4 = lVar4 + 8;
  } while (!bVar2);
  return pBVar1;
}

Assistant:

BinCompat const* BinCompat::get(std::string_view name) noexcept {
        for (auto version: bin_versions) {
            if (version->name() == name) {
                return version;
            }
        }
        return nullptr;
    }